

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * toUpperCase(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  bool bVar5;
  bool bVar6;
  const_iterator cStack_38;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  bool previousIsDigit;
  bool previousIsLowerCase;
  string *name_local;
  string *convertedName;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar5 = false;
  bVar6 = false;
  __end1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (name);
  cStack_38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        (name);
  while (bVar2 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,&stack0xffffffffffffffc8), ((bVar2 ^ 0xffU) & 1) != 0) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar4;
    iVar3 = isupper((int)cVar1);
    if (((iVar3 != 0) && ((bVar5 || (bVar6)))) ||
       ((iVar3 = isdigit((int)cVar1), iVar3 != 0 && (bVar5)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'_');
    }
    iVar3 = toupper((int)cVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,(char)iVar3);
    iVar3 = islower((int)cVar1);
    bVar5 = iVar3 != 0;
    iVar3 = isdigit((int)cVar1);
    bVar6 = iVar3 != 0;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpperCase( std::string const & name )
{
  std::string convertedName;
  bool        previousIsLowerCase = false;
  bool        previousIsDigit     = false;
  for ( auto c : name )
  {
    if ( ( isupper( c ) && ( previousIsLowerCase || previousIsDigit ) ) || ( isdigit( c ) && previousIsLowerCase ) )
    {
      convertedName.push_back( '_' );
    }
    convertedName.push_back( static_cast<char>( toupper( c ) ) );
    previousIsLowerCase = !!islower( c );
    previousIsDigit     = !!isdigit( c );
  }
  return convertedName;
}